

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

status_t __thiscall libchars::commands::run(commands *this,filter_t mask_)

{
  history *phVar1;
  bool bVar2;
  key_e kVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  commands *__stream;
  string local_90;
  string local_70;
  string local_40;
  filter_t local_20;
  filter_t mask__local;
  commands *this_local;
  
  local_20 = mask_;
  mask__local = (filter_t)this;
  build_commands(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&(this->super_edit_object).prompt,">");
  }
  this->mask = local_20;
  bVar2 = editor::interactive(&this->edit);
  if (bVar2) {
    reset_status(this);
LAB_0012bf45:
    __stream = this;
    editor::edit(&this->edit,&this->super_edit_object,this->timeout);
    kVar3 = editor::key(&this->edit);
    switch(kVar3) {
    case KEY_UP:
      if (this->remember != (history *)0x0) {
        bVar2 = history::searching(this->remember);
        if (!bVar2) {
          phVar1 = this->remember;
          value_abi_cxx11_(&local_70,this);
          history::set(phVar1,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        bVar2 = history::prev(this->remember);
        if (bVar2) {
          pcVar6 = history::current(this->remember);
          (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar6,0xffffffffffffffff);
        }
      }
      goto LAB_0012bf45;
    case KEY_DOWN:
      if (((this->remember != (history *)0x0) && (bVar2 = history::searching(this->remember), bVar2)
          ) && (bVar2 = history::next(this->remember), bVar2)) {
        pcVar6 = history::current(this->remember);
        (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar6,0xffffffffffffffff);
      }
      goto LAB_0012bf45;
    case KEY_PGUP:
      if (this->remember != (history *)0x0) {
        bVar2 = history::searching(this->remember);
        if ((bVar2) &&
           (sVar5 = history::search_idx(this->remember),
           sVar5 != (this->super_edit_object).insert_idx)) {
          history::cancel(this->remember);
        }
        bVar2 = history::searching(this->remember);
        if (bVar2) {
          bVar2 = history::search_prev(this->remember);
          if (bVar2) {
            pcVar6 = history::current(this->remember);
            sVar5 = history::search_idx(this->remember);
            (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar6,sVar5);
          }
        }
        else {
          phVar1 = this->remember;
          value_abi_cxx11_(&local_90,this);
          history::set(phVar1,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar2 = history::search(this->remember,(this->super_edit_object).insert_idx);
          if (bVar2) {
            pcVar6 = history::current(this->remember);
            sVar5 = history::search_idx(this->remember);
            (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar6,sVar5);
          }
        }
      }
      goto LAB_0012bf45;
    case KEY_PGDN:
      if (this->remember != (history *)0x0) {
        bVar2 = history::searching(this->remember);
        if ((bVar2) &&
           (sVar5 = history::search_idx(this->remember),
           sVar5 != (this->super_edit_object).insert_idx)) {
          history::cancel(this->remember);
        }
        bVar2 = history::searching(this->remember);
        if ((bVar2) && (bVar2 = history::search_next(this->remember), bVar2)) {
          pcVar6 = history::current(this->remember);
          sVar5 = history::search_idx(this->remember);
          (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar6,sVar5);
        }
      }
      goto LAB_0012bf45;
    default:
      editor::newline(&this->edit);
      edit_object::rewind(&this->super_edit_object,(FILE *)__stream);
      this_local._4_4_ = EMPTY;
      break;
    case KEY_TAB:
      auto_complete(this);
      goto LAB_0012bf45;
    case KEY_ENTER:
      dump_tokens(this);
      editor::newline(&this->edit);
      edit_object::rewind(&this->super_edit_object,(FILE *)__stream);
      if (this->remember != (history *)0x0) {
        if ((((this->status == TERMINATED) || (this->status == EMPTY)) ||
            (this->remember == (history *)0x0)) ||
           (sVar5 = edit_object::length(&this->super_edit_object), sVar5 == 0)) {
          history::cancel(this->remember);
        }
        else {
          phVar1 = this->remember;
          value_abi_cxx11_(&local_40,this);
          history::add(phVar1,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      return this->status;
    case KEY_HELP:
      uVar4 = (this->super_edit_object).insert_idx;
      sVar5 = edit_object::length(&this->super_edit_object);
      if (sVar5 <= uVar4) {
        show_help(this);
      }
      goto LAB_0012bf45;
    case KEY_QUIT:
      editor::newline(&this->edit);
      edit_object::rewind(&this->super_edit_object,(FILE *)__stream);
      return TERMINATED;
    case SEQ_TIMEOUT:
      return TIMEOUT;
    case FORCED_RET:
      this_local._4_4_ = FORCED_RETURN;
    }
  }
  else {
    parse(this);
    this_local._4_4_ = this->status;
  }
  return this_local._4_4_;
}

Assistant:

commands::status_t commands::run(command::filter_t mask_)
    {
        build_commands();

        if (this->prompt.empty())
          this->prompt = ">";
        this->mask = mask_;

        if (!edit.interactive()) {
          parse();
          return status;
        }
        else {
          // reset command structures before starting new command string
          reset_status();

          while (true) {
              (void)edit.edit(*this,timeout);
              switch (edit.key()) {
              case SEQ_TIMEOUT:
                  return TIMEOUT;
              case FORCED_RET:
                  return FORCED_RETURN;
              case KEY_ENTER:
                  //TODO: remove quotes from strings
                  dump_tokens();
                  edit.newline();
                  rewind();
                  // record current line in history
                  if (remember != NULL) {
                      if (status != TERMINATED && status != EMPTY && remember != NULL && length() > 0)
                          remember->add(value());
                      else
                          remember->cancel();
                  }
                  return status;
              case KEY_TAB:
                  auto_complete();
                  break;
              case KEY_HELP:
                  if (insert_idx >= length())
                      show_help();
                  break;
              case KEY_QUIT:
                  edit.newline();
                  rewind();
                  return TERMINATED;
              case KEY_UP:
                  if (remember != NULL) {
                      if (!remember->searching())
                          remember->set(value());
                      if (remember->prev())
                          set(remember->current());
                  }
                  break;
              case KEY_DOWN:
                  if (remember != NULL && remember->searching() && remember->next())
                      set(remember->current());
                  break;
              case KEY_PGUP:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (!remember->searching()) {
                          remember->set(value());
                          if (remember->search(insert_idx)) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                      else {
                          if (remember->search_prev()) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                  }
                  break;
              case KEY_PGDN:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (remember->searching() && remember->search_next())
                          set(remember->current(),remember->search_idx());
                  }
                  break;
              default:
                  edit.newline();
                  rewind();
                  return EMPTY;
              }
          }
        }

        return EMPTY;
    }